

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomWidget::write(DomWidget *this,int __fd,void *__buf,size_t __n)

{
  DomProperty **ppDVar1;
  DomProperty *pDVar2;
  DomRow **ppDVar3;
  DomRow *this_00;
  DomColumn **ppDVar4;
  DomColumn *this_01;
  DomItem **ppDVar5;
  DomItem *this_02;
  DomLayout **ppDVar6;
  DomLayout *this_03;
  DomWidget **ppDVar7;
  DomWidget *this_04;
  DomAction **ppDVar8;
  DomAction *this_05;
  DomActionGroup **ppDVar9;
  DomActionGroup *this_06;
  DomActionRef **ppDVar10;
  DomActionRef *this_07;
  char16_t *pcVar11;
  QString *v_1;
  long lVar12;
  QString *pQVar13;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar14;
  char16_t *str;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar15;
  long lVar16;
  QString *v;
  long in_FS_OFFSET;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  size_t sStack_90;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar14._4_4_ = in_register_00000034;
  aVar14._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar12 = *(long *)((long)__buf + 0x10);
  if (lVar12 == 0) {
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_50.d = (Data *)0x0;
    local_50.ptr = L"widget";
    local_68.size = 0;
    local_50.size = 6;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar22.m_size = (size_t)local_50.ptr;
  QVar22.field_0.m_data = aVar14.m_data;
  QXmlStreamWriter::writeStartElement(QVar22);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar12 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (this->m_has_attr_class == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"class",5);
    QVar17.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_class).d.d;
    __n = (size_t)(this->m_attr_class).d.ptr;
    local_80.size = (this->m_attr_class).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar17.m_size = __n;
    QVar23.m_size = (size_t)local_50.ptr;
    QVar23.field_0.m_data = aVar14.m_data;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar23,QVar17);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_name == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"name",4);
    QVar18.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_name).d.d;
    __n = (size_t)(this->m_attr_name).d.ptr;
    local_80.size = (this->m_attr_name).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar18.m_size = __n;
    QVar24.m_size = (size_t)local_50.ptr;
    QVar24.field_0.m_data = aVar14.m_data;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar24,QVar18);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_native == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"native",6);
    pcVar11 = local_50.ptr;
    aVar15.m_data = (void *)(local_50.size | 0x8000000000000000);
    if (this->m_attr_native == true) {
      str = L"true";
      sStack_90 = 4;
    }
    else {
      str = L"false";
      sStack_90 = 5;
    }
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,str,sStack_90);
    QVar19.m_size = (size_t)local_80.ptr;
    QVar19.field_0.m_data = aVar15.m_data;
    QVar25.m_size = (size_t)pcVar11;
    QVar25.field_0.m_data = aVar14.m_data;
    __n = (size_t)local_80.ptr;
    QXmlStreamWriter::writeAttribute(QVar25,QVar19);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  pQVar13 = (this->m_class).d.ptr;
  for (lVar12 = (this->m_class).d.size * 0x18; lVar12 != 0; lVar12 = lVar12 + -0x18) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"class",5);
    QVar20.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    __n = (size_t)(pQVar13->d).ptr;
    QVar20.m_size = __n;
    QVar26.m_size = (size_t)local_50.ptr;
    QVar26.field_0.m_data = aVar14.m_data;
    QXmlStreamWriter::writeTextElement(QVar26,QVar20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    pQVar13 = pQVar13 + 1;
  }
  ppDVar1 = (this->m_property).d.ptr;
  lVar12 = (this->m_property).d.size;
  for (lVar16 = 0; lVar12 << 3 != lVar16; lVar16 = lVar16 + 8) {
    pDVar2 = *(DomProperty **)((long)ppDVar1 + lVar16);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"property",8);
    DomProperty::write(pDVar2,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar1 = (this->m_attribute).d.ptr;
  lVar12 = (this->m_attribute).d.size;
  for (lVar16 = 0; lVar12 << 3 != lVar16; lVar16 = lVar16 + 8) {
    pDVar2 = *(DomProperty **)((long)ppDVar1 + lVar16);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"attribute",9);
    DomProperty::write(pDVar2,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar3 = (this->m_row).d.ptr;
  lVar12 = (this->m_row).d.size;
  for (lVar16 = 0; lVar12 << 3 != lVar16; lVar16 = lVar16 + 8) {
    this_00 = *(DomRow **)((long)ppDVar3 + lVar16);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"row",3);
    DomRow::write(this_00,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar4 = (this->m_column).d.ptr;
  lVar12 = (this->m_column).d.size;
  for (lVar16 = 0; lVar12 << 3 != lVar16; lVar16 = lVar16 + 8) {
    this_01 = *(DomColumn **)((long)ppDVar4 + lVar16);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"column",6);
    DomColumn::write(this_01,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar5 = (this->m_item).d.ptr;
  lVar12 = (this->m_item).d.size;
  for (lVar16 = 0; lVar12 << 3 != lVar16; lVar16 = lVar16 + 8) {
    this_02 = *(DomItem **)((long)ppDVar5 + lVar16);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"item",4);
    DomItem::write(this_02,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar6 = (this->m_layout).d.ptr;
  lVar12 = (this->m_layout).d.size;
  for (lVar16 = 0; lVar12 << 3 != lVar16; lVar16 = lVar16 + 8) {
    this_03 = *(DomLayout **)((long)ppDVar6 + lVar16);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"layout",6);
    DomLayout::write(this_03,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar7 = (this->m_widget).d.ptr;
  lVar12 = (this->m_widget).d.size;
  for (lVar16 = 0; lVar12 << 3 != lVar16; lVar16 = lVar16 + 8) {
    this_04 = *(DomWidget **)((long)ppDVar7 + lVar16);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"widget",6);
    write(this_04,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar8 = (this->m_action).d.ptr;
  lVar12 = (this->m_action).d.size;
  for (lVar16 = 0; lVar12 << 3 != lVar16; lVar16 = lVar16 + 8) {
    this_05 = *(DomAction **)((long)ppDVar8 + lVar16);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"action",6);
    DomAction::write(this_05,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar9 = (this->m_actionGroup).d.ptr;
  lVar12 = (this->m_actionGroup).d.size;
  for (lVar16 = 0; lVar12 << 3 != lVar16; lVar16 = lVar16 + 8) {
    this_06 = *(DomActionGroup **)((long)ppDVar9 + lVar16);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"actiongroup",0xb);
    DomActionGroup::write(this_06,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  ppDVar10 = (this->m_addAction).d.ptr;
  lVar12 = (this->m_addAction).d.size;
  for (lVar16 = 0; lVar12 << 3 != lVar16; lVar16 = lVar16 + 8) {
    this_07 = *(DomActionRef **)((long)ppDVar10 + lVar16);
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"addaction",9);
    DomActionRef::write(this_07,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  pQVar13 = (this->m_zOrder).d.ptr;
  for (lVar12 = (this->m_zOrder).d.size * 0x18; lVar12 != 0; lVar12 = lVar12 + -0x18) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"zorder",6);
    QVar21.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    QVar21.m_size = (size_t)(pQVar13->d).ptr;
    QVar27.m_size = (size_t)local_50.ptr;
    QVar27.field_0.m_data = aVar14.m_data;
    QXmlStreamWriter::writeTextElement(QVar27,QVar21);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    pQVar13 = pQVar13 + 1;
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomWidget::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("widget") : tagName.toLower());

    if (hasAttributeClass())
        writer.writeAttribute(u"class"_s, attributeClass());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    if (hasAttributeNative())
        writer.writeAttribute(u"native"_s, (attributeNative() ? u"true"_s : u"false"_s));

    for (const QString &v : m_class)
        writer.writeTextElement(u"class"_s, v);

    for (DomProperty *v : m_property)
        v->write(writer, u"property"_s);

    for (DomProperty *v : m_attribute)
        v->write(writer, u"attribute"_s);

    for (DomRow *v : m_row)
        v->write(writer, u"row"_s);

    for (DomColumn *v : m_column)
        v->write(writer, u"column"_s);

    for (DomItem *v : m_item)
        v->write(writer, u"item"_s);

    for (DomLayout *v : m_layout)
        v->write(writer, u"layout"_s);

    for (DomWidget *v : m_widget)
        v->write(writer, u"widget"_s);

    for (DomAction *v : m_action)
        v->write(writer, u"action"_s);

    for (DomActionGroup *v : m_actionGroup)
        v->write(writer, u"actiongroup"_s);

    for (DomActionRef *v : m_addAction)
        v->write(writer, u"addaction"_s);

    for (const QString &v : m_zOrder)
        writer.writeTextElement(u"zorder"_s, v);

    writer.writeEndElement();
}